

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O3

bool s2shapeutil::EncodeTaggedShapes
               (S2ShapeIndex *index,ShapeEncoder *shape_encoder,Encoder *encoder)

{
  uint uVar1;
  int iVar2;
  uint32 v;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  StringVectorEncoder shape_vector;
  Encoder *local_80;
  ostream *local_78;
  Encoder *local_70;
  StringVectorEncoder local_68;
  S2Shape *pSVar3;
  
  local_70 = encoder;
  s2coding::StringVectorEncoder::StringVectorEncoder(&local_68);
  uVar1 = (*index->_vptr_S2ShapeIndex[2])(index);
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      iVar2 = (*index->_vptr_S2ShapeIndex[3])(index,uVar5);
      pSVar3 = (S2Shape *)CONCAT44(extraout_var,iVar2);
      local_80 = (Encoder *)Encoder::length(&local_68.data_);
      if (local_68.offsets_.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.offsets_.
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>
                  (&local_68.offsets_,
                   (iterator)
                   local_68.offsets_.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long_long *)&local_80);
      }
      else {
        *local_68.offsets_.
         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long_long)local_80;
        local_68.offsets_.
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.offsets_.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (pSVar3 != (S2Shape *)0x0) {
        v = (*pSVar3->_vptr_S2Shape[10])(pSVar3);
        if (v == 0) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_80,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_coding.cc"
                     ,0xa8,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_78,"Unsupported S2Shape type: ",0x1a);
          std::ostream::operator<<(local_78,0);
          abort();
        }
        Encoder::Ensure(&local_68.data_,5);
        local_68.data_.buf_ = (uchar *)Varint::Encode32((char *)local_68.data_.buf_,v);
        local_80 = &local_68.data_;
        if ((shape_encoder->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*shape_encoder->_M_invoker)((_Any_data *)shape_encoder,pSVar3,&local_80);
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar1 != uVar4);
  }
  s2coding::StringVectorEncoder::Encode(&local_68,local_70);
  Encoder::~Encoder(&local_68.data_);
  if (local_68.offsets_.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.offsets_.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool EncodeTaggedShapes(const S2ShapeIndex& index,
                        const ShapeEncoder& shape_encoder,
                        Encoder* encoder) {
  s2coding::StringVectorEncoder shape_vector;
  for (S2Shape* shape : index) {
    Encoder* sub_encoder = shape_vector.AddViaEncoder();
    if (shape == nullptr) continue;  // Encode as zero bytes.

    uint32 tag = shape->type_tag();
    if (tag == S2Shape::kNoTypeTag) {
      S2_LOG(DFATAL) << "Unsupported S2Shape type: " << tag;
      return false;
    }
    sub_encoder->Ensure(Encoder::kVarintMax32);
    sub_encoder->put_varint32(tag);
    shape_encoder(*shape, sub_encoder);
  }
  shape_vector.Encode(encoder);
  return true;
}